

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_type __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
::
erase<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,key_arg<Int> *key)

{
  char *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  ctrl_t h;
  ulong uVar9;
  long lVar10;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  ulong i;
  ulong uVar11;
  long lVar12;
  byte in_R11B;
  uint uVar13;
  bool bVar14;
  __m128i match_1;
  undefined1 auVar15 [16];
  __m128i match;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  
  uVar2 = key->value;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  uVar9 = SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),8) +
          SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),0);
  i = (ulong)((((uint)(uVar9 >> 0x18) & 0xff ^
               (uint)(uVar9 >> 8) & 0xffffff ^ (uint)(uVar9 >> 0x10) & 0xffff) & 0xf) * 0x30);
  uVar8 = *(ulong *)(this + i + 0x18);
  if ((uVar8 + 1 & uVar8) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             *)(this + i);
  uVar11 = uVar9 >> 7 & uVar8;
  pcVar3 = this_00->ctrl_;
  auVar15 = ZEXT216(CONCAT11((char)uVar9,(char)uVar9) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  lVar10 = 0;
  do {
    pcVar1 = pcVar3 + uVar11;
    cVar19 = auVar15[0];
    auVar20[0] = -(cVar19 == *pcVar1);
    cVar21 = auVar15[1];
    auVar20[1] = -(cVar21 == pcVar1[1]);
    cVar22 = auVar15[2];
    auVar20[2] = -(cVar22 == pcVar1[2]);
    cVar23 = auVar15[3];
    auVar20[3] = -(cVar23 == pcVar1[3]);
    auVar20[4] = -(cVar19 == pcVar1[4]);
    auVar20[5] = -(cVar21 == pcVar1[5]);
    auVar20[6] = -(cVar22 == pcVar1[6]);
    auVar20[7] = -(cVar23 == pcVar1[7]);
    auVar20[8] = -(cVar19 == pcVar1[8]);
    auVar20[9] = -(cVar21 == pcVar1[9]);
    auVar20[10] = -(cVar22 == pcVar1[10]);
    auVar20[0xb] = -(cVar23 == pcVar1[0xb]);
    auVar20[0xc] = -(cVar19 == pcVar1[0xc]);
    auVar20[0xd] = -(cVar21 == pcVar1[0xd]);
    auVar20[0xe] = -(cVar22 == pcVar1[0xe]);
    auVar20[0xf] = -(cVar23 == pcVar1[0xf]);
    uVar6 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
    bVar14 = uVar6 == 0;
    if (!bVar14) {
      uVar13 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      i = uVar13 + uVar11 & uVar8;
      uVar9 = this_00->slots_[i].value.first.value;
      in_R11B = uVar9 == uVar2 | in_R11B;
      if (uVar9 == uVar2) {
        bVar14 = false;
      }
      else {
        uVar13 = uVar6 - 1 & (uint)uVar6;
        if (uVar13 == 0) {
          bVar14 = true;
        }
        else {
          do {
            uVar4 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            i = uVar4 + uVar11 & uVar8;
            uVar9 = this_00->slots_[i].value.first.value;
            in_R11B = uVar9 == uVar2 | in_R11B;
          } while ((uVar9 != uVar2) && (uVar13 = uVar13 - 1 & uVar13, uVar13 != 0));
          bVar14 = uVar9 != uVar2;
        }
      }
    }
    if (bVar14) {
      auVar18[0] = -(*pcVar1 == -0x80);
      auVar18[1] = -(pcVar1[1] == -0x80);
      auVar18[2] = -(pcVar1[2] == -0x80);
      auVar18[3] = -(pcVar1[3] == -0x80);
      auVar18[4] = -(pcVar1[4] == -0x80);
      auVar18[5] = -(pcVar1[5] == -0x80);
      auVar18[6] = -(pcVar1[6] == -0x80);
      auVar18[7] = -(pcVar1[7] == -0x80);
      auVar18[8] = -(pcVar1[8] == -0x80);
      auVar18[9] = -(pcVar1[9] == -0x80);
      auVar18[10] = -(pcVar1[10] == -0x80);
      auVar18[0xb] = -(pcVar1[0xb] == -0x80);
      auVar18[0xc] = -(pcVar1[0xc] == -0x80);
      auVar18[0xd] = -(pcVar1[0xd] == -0x80);
      auVar18[0xe] = -(pcVar1[0xe] == -0x80);
      auVar18[0xf] = -(pcVar1[0xf] == -0x80);
      if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar18 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar18 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar18 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar18 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar18 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar18 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar18 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar18 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar18 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar18 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar18 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar18[0xf])
      {
        lVar12 = uVar11 + lVar10;
        lVar10 = lVar10 + 0x10;
        uVar11 = lVar12 + 0x10U & uVar8;
        bVar14 = true;
      }
      else {
        bVar14 = false;
        in_R11B = 0;
      }
    }
    else {
      bVar14 = false;
    }
  } while (bVar14);
  if ((in_R11B & 1) == 0) {
    i = uVar8;
  }
  if (i != uVar8) {
    if (pcVar3[i] < '\0') {
      __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x7c8,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::erase_meta_only(const_iterator) [Policy = phmap::priv::FlatHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                   );
    }
    this_00->size_ = this_00->size_ - 1;
    pcVar1 = pcVar3 + (i - 0x10 & uVar8);
    auVar16[0] = -(*pcVar1 == -0x80);
    auVar16[1] = -(pcVar1[1] == -0x80);
    auVar16[2] = -(pcVar1[2] == -0x80);
    auVar16[3] = -(pcVar1[3] == -0x80);
    auVar16[4] = -(pcVar1[4] == -0x80);
    auVar16[5] = -(pcVar1[5] == -0x80);
    auVar16[6] = -(pcVar1[6] == -0x80);
    auVar16[7] = -(pcVar1[7] == -0x80);
    auVar16[8] = -(pcVar1[8] == -0x80);
    auVar16[9] = -(pcVar1[9] == -0x80);
    auVar16[10] = -(pcVar1[10] == -0x80);
    auVar16[0xb] = -(pcVar1[0xb] == -0x80);
    auVar16[0xc] = -(pcVar1[0xc] == -0x80);
    auVar16[0xd] = -(pcVar1[0xd] == -0x80);
    auVar16[0xe] = -(pcVar1[0xe] == -0x80);
    auVar16[0xf] = -(pcVar1[0xf] == -0x80);
    uVar6 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
    bVar14 = false;
    if (uVar6 != 0) {
      pcVar1 = pcVar3 + i;
      auVar17[0] = -(*pcVar1 == -0x80);
      auVar17[1] = -(pcVar1[1] == -0x80);
      auVar17[2] = -(pcVar1[2] == -0x80);
      auVar17[3] = -(pcVar1[3] == -0x80);
      auVar17[4] = -(pcVar1[4] == -0x80);
      auVar17[5] = -(pcVar1[5] == -0x80);
      auVar17[6] = -(pcVar1[6] == -0x80);
      auVar17[7] = -(pcVar1[7] == -0x80);
      auVar17[8] = -(pcVar1[8] == -0x80);
      auVar17[9] = -(pcVar1[9] == -0x80);
      auVar17[10] = -(pcVar1[10] == -0x80);
      auVar17[0xb] = -(pcVar1[0xb] == -0x80);
      auVar17[0xc] = -(pcVar1[0xc] == -0x80);
      auVar17[0xd] = -(pcVar1[0xd] == -0x80);
      auVar17[0xe] = -(pcVar1[0xe] == -0x80);
      auVar17[0xf] = -(pcVar1[0xf] == -0x80);
      uVar7 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
      if (uVar7 != 0) {
        iVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        uVar13 = 0x1f;
        if (uVar6 != 0) {
          for (; ((uint)uVar6 << 0x10) >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        bVar14 = (uVar13 ^ 0x1f) + iVar5 < 0x10;
      }
    }
    h = -2;
    if (bVar14 != false) {
      h = -0x80;
    }
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
    ::set_ctrl(this_00,i,h);
    uVar8 = (ulong)bVar14;
    (this_00->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (this_00->settings_).
         super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + uVar8;
  }
  return uVar8;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto always_erase =  [](const value_type&){ return true; };
        return erase_if_impl<K, decltype(always_erase), ReadWriteLock>(key, std::move(always_erase));
    }